

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_isBaseUnitsImported_Test::Units_isBaseUnitsImported_Test(Units_isBaseUnitsImported_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0016cea8;
  return;
}

Assistant:

TEST(Units, isBaseUnitsImported)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u");

    model->addUnits(u1);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("some_u");

    libcellml::ImportSourcePtr importSource = libcellml::ImportSource::create();
    importSource->setUrl("I_am_a_url");
    importSource->setModel(model);

    u2->setImportSource(importSource);
    u2->setImportReference("u");

    EXPECT_TRUE(u2->isImport());
    EXPECT_TRUE(u2->isBaseUnit());
}